

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_disks.cpp
# Opt level: O2

int benchmark_disks_alloc<foxxll::simple_random>
              (external_size_type size,external_size_type start_offset,size_t batch_size,
              size_t raw_block_size,string *optrw)

{
  long *plVar1;
  undefined8 *puVar2;
  BID *b;
  long lVar3;
  long lVar4;
  instance_pointer this;
  ulong *puVar5;
  uint *puVar6;
  pointer pBVar7;
  instance_pointer this_00;
  ostream *poVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  size_t j_2;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *pCVar12;
  ulong uVar13;
  external_size_type number;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  size_t j;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  undefined4 uVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  allocator local_4ba;
  allocator local_4b9;
  ulong local_4b8;
  long local_4b0;
  double local_4a8;
  double local_4a0;
  ulong local_498;
  long local_490;
  ulong *local_488;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_480;
  vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> bids;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> buffer;
  string local_3e8;
  simple_random alloc;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_370;
  string local_368;
  stringstream ss;
  undefined8 uStack_340;
  long local_338 [47];
  simple_random local_1c0;
  string local_1a8 [11];
  
  lVar3 = std::__cxx11::string::find((char)optrw,0x72);
  lVar4 = std::__cxx11::string::find((char)optrw,0x77);
  foxxll::singleton<foxxll::block_manager,_true>::get_instance();
  if (batch_size == 0) {
    this = foxxll::singleton<foxxll::config,_true>::get_instance();
    batch_size = foxxll::config::disks_number(this);
  }
  uVar13 = ((batch_size * raw_block_size) / raw_block_size + 1) -
           (ulong)((batch_size * raw_block_size) % raw_block_size == 0);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            (&buffer,uVar13,(allocator_type *)&ss);
  uVar10 = 0xffffffffffffffff;
  if (uVar13 * 8 < 0xfffffffffffffff8) {
    uVar10 = uVar13 * 8 + 8;
  }
  puVar5 = (ulong *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar10);
  *puVar5 = uVar13;
  auVar27 = _DAT_00150750;
  auVar26 = _DAT_00150740;
  if (uVar13 != 0) {
    uVar10 = uVar13 + 0x1fffffffffffffff & 0x1fffffffffffffff;
    auVar22._8_4_ = (int)uVar10;
    auVar22._0_8_ = uVar10;
    auVar22._12_4_ = (int)(uVar10 >> 0x20);
    lVar11 = 0;
    auVar22 = auVar22 ^ _DAT_00150750;
    do {
      auVar29._8_4_ = (int)lVar11;
      auVar29._0_8_ = lVar11;
      auVar29._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar29 = (auVar29 | auVar26) ^ auVar27;
      if ((bool)(~(auVar29._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar29._0_4_ ||
                  auVar22._4_4_ < auVar29._4_4_) & 1)) {
        puVar5[lVar11 + 1] = 0;
      }
      if ((auVar29._12_4_ != auVar22._12_4_ || auVar29._8_4_ <= auVar22._8_4_) &&
          auVar29._12_4_ <= auVar22._12_4_) {
        puVar5[lVar11 + 2] = 0;
      }
      lVar11 = lVar11 + 2;
    } while ((uVar10 - ((uint)(uVar13 + 0x1fffffffffffffff) & 1)) + 2 != lVar11);
  }
  bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tlx::Logger::Logger((Logger *)&ss);
  std::operator<<((ostream *)&ss,"# Batch size: ");
  std::__cxx11::string::string((string *)&local_3e8,"B",&local_4b9);
  number = uVar13 * raw_block_size;
  foxxll::add_IEC_binary_multiplier(local_1a8,number,&local_3e8);
  std::operator<<((ostream *)&ss,(string *)local_1a8);
  std::operator<<((ostream *)&ss," (");
  std::ostream::_M_insert<unsigned_long>((ulong)&ss);
  std::operator<<((ostream *)&ss," blocks of ");
  std::__cxx11::string::string((string *)&local_368,"B",&local_4ba);
  foxxll::add_IEC_binary_multiplier((string *)&alloc,raw_block_size,&local_368);
  std::operator<<((ostream *)&ss,(string *)&alloc);
  std::operator<<((ostream *)&ss,")");
  std::operator<<((ostream *)&ss," using ");
  foxxll::simple_random::simple_random(&local_1c0);
  std::operator<<((ostream *)&ss,"simple randomized striping");
  uVar10 = -(ulong)(size == 0) | start_offset + size;
  local_480 = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(puVar5 + 1);
  std::__cxx11::string::~string((string *)&alloc);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&local_3e8);
  tlx::Logger::~Logger((Logger *)&ss);
  for (uVar17 = 0; uVar17 < uVar13; uVar17 = uVar17 + 1) {
    puVar6 = (uint *)foxxll::aligned_alloc<4096ul>(raw_block_size,0);
    buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = puVar6;
  }
  lVar11 = 0;
  for (uVar17 = 0; uVar17 < uVar13; uVar17 = uVar17 + 1) {
    for (uVar14 = 0; raw_block_size >> 2 != uVar14; uVar14 = uVar14 + 1) {
      buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17][uVar14] = (int)lVar11 + (int)uVar14;
    }
    lVar11 = lVar11 + (raw_block_size >> 2);
  }
  foxxll::simple_random::simple_random(&alloc);
  dVar19 = foxxll::timestamp();
  local_4a0 = 0.0;
  uVar17 = 0;
  local_4a8 = 0.0;
  local_4b0 = 0;
  local_490 = 0;
  local_4b8 = uVar13;
  local_488 = puVar5;
  do {
    uVar14 = uVar10 - uVar17;
    if (uVar10 < uVar17 || uVar14 == 0) {
LAB_0012b143:
      tlx::Logger::Logger((Logger *)&ss);
      std::operator<<((ostream *)&ss,
                      "=============================================================================================\n"
                     );
      std::operator<<((ostream *)&ss,"# Average over ");
      *(undefined8 *)((long)local_338 + *(long *)(_ss + -0x18)) = 7;
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      std::operator<<((ostream *)&ss," MiB: ");
      *(undefined8 *)((long)local_338 + *(long *)(_ss + -0x18)) = 5;
      *(undefined8 *)((long)&uStack_340 + *(long *)(_ss + -0x18)) = 1;
      auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)local_4b0);
      auVar23._8_4_ = (int)((ulong)local_4b0 >> 0x20);
      auVar23._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                ((((auVar23._8_8_ - 1.9342813113834067e+25) + (auVar23._0_8_ - 4503599627370496.0))
                 * 9.5367431640625e-07) / local_4a0);
      std::operator<<((ostream *)&ss," MiB/s write, ");
      *(undefined8 *)((long)local_338 + *(long *)(_ss + -0x18)) = 5;
      *(undefined8 *)((long)&uStack_340 + *(long *)(_ss + -0x18)) = 1;
      auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)local_490);
      auVar24._8_4_ = (int)((ulong)local_490 >> 0x20);
      auVar24._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                ((((auVar24._8_8_ - 1.9342813113834067e+25) + (auVar24._0_8_ - 4503599627370496.0))
                 * 9.5367431640625e-07) / local_4a8);
      std::operator<<((ostream *)&ss," MiB/s read");
      tlx::Logger::~Logger((Logger *)&ss);
      poVar8 = std::operator<<((ostream *)&std::cout,"RESULT");
      pcVar9 = getenv("RESULT");
      pcVar15 = "";
      if (pcVar9 != (char *)0x0) {
        pcVar15 = pcVar9;
      }
      poVar8 = std::operator<<(poVar8,pcVar15);
      poVar8 = std::operator<<(poVar8," size=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," op=");
      poVar8 = std::operator<<(poVar8,(string *)optrw);
      poVar8 = std::operator<<(poVar8," block_size=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," batch_size=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," offset=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::operator<<(poVar8," write_time=");
      poVar8 = std::ostream::_M_insert<double>(local_4a0);
      std::operator<<(poVar8," read_time=");
      poVar8 = std::ostream::_M_insert<double>(local_4a8);
      poVar8 = std::operator<<(poVar8," write_size=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," read_size=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::operator<<(poVar8," time=");
      poVar8 = std::ostream::_M_insert<double>(local_4a0 + local_4a8);
      poVar8 = std::operator<<(poVar8," total_size=");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      uVar10 = *puVar5 * 8;
      uVar17 = uVar10;
      uVar14 = *puVar5;
      while (uVar14 != 0) {
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                  ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                   ((long)puVar5 + uVar17));
        uVar17 = uVar17 - 8;
        uVar14 = uVar17;
      }
      operator_delete__(puVar5,uVar10 + 8);
      for (uVar10 = 0; uVar10 < uVar13; uVar10 = uVar10 + 1) {
        foxxll::aligned_dealloc<4096ul>
                  (buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10]);
      }
      std::_Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::~_Vector_base
                (&bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>);
      std::_Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~_Vector_base
                (&buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>);
      return 0;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    local_498 = uVar14;
    if (number <= uVar14) {
      local_498 = number;
    }
    uVar14 = (local_498 / raw_block_size + 1) - (ulong)(local_498 % raw_block_size == 0);
    lVar11 = (long)bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::resize
              (&bids,lVar11 / 0x18 + uVar14);
    for (pBVar7 = bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar7 != bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pBVar7 = pBVar7 + 1) {
      pBVar7->size = raw_block_size;
    }
    this_00 = foxxll::singleton<foxxll::block_manager,_true>::get_instance();
    foxxll::block_manager::
    new_blocks<foxxll::simple_random,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
              (this_00,&alloc,
               (BID<0UL> *)
               ((long)bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar11),
               (__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                )bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,0);
    uVar18 = local_498;
    if (start_offset <= uVar17) {
      if (g_quiet == false) {
        poVar8 = std::operator<<((ostream *)local_338,"Offset    ");
        *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 7;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8," MiB: ");
        *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
             *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
      }
      dVar20 = foxxll::timestamp();
      if (lVar4 == -1) {
        dVar21 = 0.0;
      }
      else {
        lVar16 = lVar11 + 8;
        pCVar12 = local_480;
        for (uVar13 = 0; puVar5 = local_488, uVar13 < uVar14; uVar13 = uVar13 + 1) {
          local_388 = 0;
          uStack_380 = 0;
          local_378 = 0;
          _Stack_370._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          plVar1 = *(long **)((long)bids.
                                    super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8);
          (**(code **)(*plVar1 + 8))
                    (local_1a8,plVar1,
                     buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar13],
                     *(undefined8 *)
                      ((long)&(bids.
                               super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->storage + lVar16),
                     raw_block_size,&local_388);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator=
                    (pCVar12,(CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                             local_1a8);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_370);
          lVar16 = lVar16 + 0x18;
          pCVar12 = pCVar12 + 1;
        }
        foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                  (local_480,local_480 + uVar14);
        dVar21 = foxxll::timestamp();
        dVar21 = dVar21 - dVar20;
        local_4b0 = local_4b0 + local_498;
        local_4a0 = local_4a0 + dVar21;
      }
      uVar25 = (undefined4)local_498;
      uVar28 = (undefined4)(local_498 >> 0x20);
      if (g_quiet == false) {
        *(undefined8 *)((long)local_338 + *(long *)(local_338[0] + -0x18) + 0x10) = 5;
        *(undefined8 *)((long)local_338 + *(long *)(local_338[0] + -0x18) + 8) = 1;
        auVar26._0_8_ = (double)CONCAT44(0x43300000,uVar25);
        auVar26._8_4_ = uVar28;
        auVar26._12_4_ = 0x45300000;
        poVar8 = std::ostream::_M_insert<double>
                           ((((auVar26._8_8_ - 1.9342813113834067e+25) +
                             (auVar26._0_8_ - 4503599627370496.0)) * 9.5367431640625e-07) / dVar21);
        std::operator<<(poVar8," MiB/s write, ");
      }
      dVar20 = foxxll::timestamp();
      if (lVar3 == -1) {
        dVar21 = 0.0;
      }
      else {
        lVar11 = lVar11 + 8;
        pCVar12 = local_480;
        for (uVar13 = 0; puVar5 = local_488, uVar13 < uVar14; uVar13 = uVar13 + 1) {
          local_3a8 = 0;
          uStack_3a0 = 0;
          local_398 = 0;
          _Stack_390._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          puVar2 = *(undefined8 **)
                    ((long)bids.
                           super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
          (**(code **)*puVar2)
                    (local_1a8,puVar2,
                     buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar13],
                     *(undefined8 *)
                      ((long)&(bids.
                               super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->storage + lVar11),
                     raw_block_size,&local_3a8);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator=
                    (pCVar12,(CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                             local_1a8);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_390);
          lVar11 = lVar11 + 0x18;
          pCVar12 = pCVar12 + 1;
        }
        foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                  (local_480,local_480 + uVar14);
        dVar21 = foxxll::timestamp();
        dVar21 = dVar21 - dVar20;
        local_490 = local_490 + local_498;
        local_4a8 = local_4a8 + dVar21;
      }
      if (g_quiet == false) {
        *(undefined8 *)((long)local_338 + *(long *)(local_338[0] + -0x18) + 0x10) = 5;
        *(undefined8 *)((long)local_338 + *(long *)(local_338[0] + -0x18) + 8) = 1;
        auVar27._0_8_ = (double)CONCAT44(0x43300000,uVar25);
        auVar27._8_4_ = uVar28;
        auVar27._12_4_ = 0x45300000;
        poVar8 = std::ostream::_M_insert<double>
                           ((((auVar27._8_8_ - 1.9342813113834067e+25) +
                             (auVar27._0_8_ - 4503599627370496.0)) * 9.5367431640625e-07) / dVar21);
        std::operator<<(poVar8," MiB/s read");
      }
      uVar18 = local_498;
      if ((g_quiet & 1U) == 0) {
        tlx::Logger::Logger((Logger *)local_1a8);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)local_1a8,(string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        tlx::Logger::~Logger((Logger *)local_1a8);
      }
      dVar20 = foxxll::timestamp();
      uVar13 = local_4b8;
      if (g_time_limit < dVar20 - dVar19) {
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        goto LAB_0012b143;
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    uVar17 = uVar17 + uVar18;
  } while( true );
}

Assistant:

int benchmark_disks_alloc(
    external_size_type size, external_size_type start_offset,
    size_t batch_size, const size_t raw_block_size,
    const std::string& optrw)
{
    external_size_type endpos = start_offset + size;

    if (size == 0)
        endpos = std::numeric_limits<external_size_type>::max();

    bool do_read = (optrw.find('r') != std::string::npos);
    bool do_write = (optrw.find('w') != std::string::npos);

    // initialize disk configuration
    foxxll::block_manager::get_instance();

    // construct block type

    const size_t block_size = raw_block_size / sizeof(uint32_t);

    using block_type = uint32_t *;
    using BID = foxxll::BID<0>;

    if (batch_size == 0)
        batch_size = foxxll::config::get_instance()->disks_number();

    // calculate total bytes processed in a batch
    batch_size = raw_block_size * batch_size;

    size_t num_blocks_per_batch = foxxll::div_ceil(batch_size, raw_block_size);
    batch_size = num_blocks_per_batch * raw_block_size;

    std::vector<block_type> buffer(num_blocks_per_batch);
    foxxll::request_ptr* reqs = new foxxll::request_ptr[num_blocks_per_batch];
    std::vector<BID> bids;
    double total_time_read = 0, total_time_write = 0;
    external_size_type total_size_read = 0, total_size_write = 0;

    LOG1 << "# Batch size: "
         << foxxll::add_IEC_binary_multiplier(batch_size, "B") << " ("
         << num_blocks_per_batch << " blocks of "
         << foxxll::add_IEC_binary_multiplier(raw_block_size, "B") << ")"
         << " using " << AllocStrategy().name();

    // allocate data blocks
    for (size_t j = 0; j < num_blocks_per_batch; ++j) {
        buffer[j] = reinterpret_cast<block_type>(
                foxxll::aligned_alloc<4096>(raw_block_size));
    }

    // touch data, so it is actually allocated
    for (size_t j = 0; j < num_blocks_per_batch; ++j) {
        for (size_t i = 0; i < block_size; ++i)
            buffer[j][i] = static_cast<uint32_t>(j * block_size + i);
    }

    try {
        AllocStrategy alloc;
        size_t current_batch_size;

        double ts_begin = timestamp();

        for (external_size_type offset = 0; offset < endpos; offset += current_batch_size)
        {
            std::stringstream ss;

            current_batch_size = static_cast<size_t>(
                    std::min<external_size_type>(batch_size, endpos - offset));
#if CHECK_AFTER_READ
            const size_t current_batch_size_int = current_batch_size / sizeof(uint32_t);
#endif
            const size_t current_num_blocks_per_batch =
                foxxll::div_ceil(current_batch_size, raw_block_size);

            size_t num_total_blocks = bids.size();
            bids.resize(num_total_blocks + current_num_blocks_per_batch);

            // fill in block size of BID<0> variable blocks
            for (BID& b : bids) b.size = raw_block_size;

            foxxll::block_manager::get_instance()->new_blocks(
                alloc, bids.begin() + num_total_blocks, bids.end()
            );

            if (offset < start_offset)
                continue;

            if (!g_quiet)
                ss << "Offset    " << std::setw(7) << (offset / MiB) << " MiB: "
                   << std::fixed;

            double begin = timestamp(), end, elapsed;

            if (do_write)
            {
                for (size_t j = 0; j < current_num_blocks_per_batch; j++)
                    reqs[j] = bids[num_total_blocks + j].write(buffer[j], raw_block_size);

                wait_all(reqs, current_num_blocks_per_batch);

                end = timestamp();
                elapsed = end - begin;
                total_size_write += current_batch_size;
                total_time_write += elapsed;
            }
            else
                elapsed = 0.0;

            if (!g_quiet)
                ss << std::setw(5) << std::setprecision(1)
                   << (double(current_batch_size) / MiB / elapsed)
                   << " MiB/s write, ";

            begin = timestamp();

            if (do_read)
            {
                for (size_t j = 0; j < current_num_blocks_per_batch; j++)
                    reqs[j] = bids[num_total_blocks + j].read(
                            buffer[j], raw_block_size
                        );

                wait_all(reqs, current_num_blocks_per_batch);

                end = timestamp();
                elapsed = end - begin;
                total_size_read += current_batch_size;
                total_time_read += elapsed;
            }
            else
                elapsed = 0.0;

            if (!g_quiet)
                ss << std::setw(5) << std::setprecision(1)
                   << (double(current_batch_size) / MiB / elapsed)
                   << " MiB/s read";

            if (!g_quiet)
                LOG1 << ss.str();

#if CHECK_AFTER_READ
            for (size_t j = 0; j < current_num_blocks_per_batch; j++)
            {
                for (size_t i = 0; i < block_size; i++)
                {
                    if (buffer[j][i] != static_cast<uint32_t>(j * block_size + i))
                    {
                        size_t ibuf = i / current_batch_size_int;
                        size_t pos = i % current_batch_size_int;

                        LOG1 << "Error on disk " << ibuf << " position "
                             << std::hex << std::setw(8)
                             << offset + pos * sizeof(uint32_t)
                             << "  got: "
                             << std::hex << std::setw(8)
                             << buffer[j][i]
                             << " wanted: "
                             << std::hex << std::setw(8)
                             << (j * block_size + i)
                             << std::dec << std::endl;

                        i = (ibuf + 1) * current_batch_size_int; // jump to next
                    }
                }
            }
#endif
            if (timestamp() - ts_begin > g_time_limit)
                break;
        }
    }
    catch (const std::exception& ex)
    {
        LOG1 << ex.what();
    }

    LOG1 << "=============================================================================================\n"
         << "# Average over " << std::setw(7) << total_size_write / MiB << " MiB: "
         << std::setw(5) << std::setprecision(1)
         << (double(total_size_write) / MiB / total_time_write) << " MiB/s write, "
         << std::setw(5) << std::setprecision(1)
         << (double(total_size_read) / MiB / total_time_read) << " MiB/s read";

    std::cout << "RESULT"
              << (getenv("RESULT") ? getenv("RESULT") : "")
              << " size=" << size
              << " op=" << optrw
              << " block_size=" << raw_block_size
              << " batch_size=" << batch_size / raw_block_size
              << " offset=" << start_offset
              << " write_time=" << total_time_write
              << " read_time=" << total_time_read
              << " write_size=" << total_size_write
              << " read_size=" << total_size_read
              << " time=" << (total_time_write + total_time_read)
              << " total_size=" << (total_size_write + total_size_read)
              << std::endl;

    delete[] reqs;

    for (size_t j = 0; j < num_blocks_per_batch; ++j)
        foxxll::aligned_dealloc<4096>(buffer[j]);

    return 0;
}